

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  scoped_padder p;
  scoped_padder sStack_58;
  byte abStack_22 [5];
  undefined2 local_1d;
  char local_1b [3];
  char *local_18;
  
  uVar3 = msg->thread_id | 1;
  lVar2 = 0x3f;
  if (uVar3 != 0) {
    for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  scoped_padder::scoped_padder
            (&sStack_58,
             (ulong)((uint)(byte)fmt::v9::detail::do_count_digits(unsigned_long)::bsr2log10[lVar2] -
                    (uint)(msg->thread_id <
                          *(ulong *)(fmt::v9::detail::do_count_digits(unsigned_long)::
                                     zero_or_powers_of_10 +
                                    (ulong)(byte)fmt::v9::detail::do_count_digits(unsigned_long)::
                                                 bsr2log10[lVar2] * 8))),
             &(this->super_flag_formatter).padinfo_,dest);
  uVar3 = msg->thread_id;
  pcVar4 = local_1b;
  uVar5 = uVar3;
  if (99 < uVar3) {
    do {
      uVar3 = uVar5 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar5 % 100) * 2);
      pcVar4 = pcVar4 + -2;
      bVar1 = 9999 < uVar5;
      uVar5 = uVar3;
    } while (bVar1);
  }
  if (uVar3 < 10) {
    pcVar4[-1] = (byte)uVar3 | 0x30;
    local_18 = pcVar4 + -1;
  }
  else {
    *(undefined2 *)(pcVar4 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + uVar3 * 2);
    local_18 = pcVar4 + -2;
  }
  fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_18,local_1b);
  scoped_padder::~scoped_padder(&sStack_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }